

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::ProcessStringHexEscape(SQLexer *this,SQChar *dest,SQInteger maxdigits)

{
  int iVar1;
  long local_28;
  SQInteger n;
  SQInteger maxdigits_local;
  SQChar *dest_local;
  SQLexer *this_local;
  
  Next(this);
  this->_currentcolumn = this->_currentcolumn + 1;
  iVar1 = isxdigit((uint)this->_currdata);
  if (iVar1 == 0) {
    Error(this,"hexadecimal number expected");
  }
  local_28 = 0;
  while (iVar1 = isxdigit((uint)this->_currdata), iVar1 != 0 && local_28 < maxdigits) {
    dest[local_28] = this->_currdata;
    local_28 = local_28 + 1;
    Next(this);
    this->_currentcolumn = this->_currentcolumn + 1;
  }
  dest[local_28] = '\0';
  return local_28;
}

Assistant:

SQInteger SQLexer::ProcessStringHexEscape(SQChar *dest, SQInteger maxdigits)
{
    NEXT();
    if (!isxdigit(CUR_CHAR)) Error(_SC("hexadecimal number expected"));
    SQInteger n = 0;
    while (isxdigit(CUR_CHAR) && n < maxdigits) {
        dest[n] = CUR_CHAR;
        n++;
        NEXT();
    }
    dest[n] = 0;
    return n;
}